

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture_utils.cpp
# Opt level: O1

GgxFilterUnifLocs tg::getFilterCubamap_ggx_unifLocs(u32 prog)

{
  GLint GVar1;
  GLint GVar2;
  GgxFilterUnifLocs GVar3;
  
  GVar3.cubemap = (*glad_debug_glGetUniformLocation)(prog,"u_cubemap");
  GVar1 = (*glad_debug_glGetUniformLocation)(prog,"u_numSamples");
  GVar2 = (*glad_debug_glGetUniformLocation)(prog,"u_rough2");
  if (((GVar3.cubemap != -1) && (GVar1 != -1)) && (GVar2 != -1)) {
    GVar3.numSamples = GVar1;
    GVar3.roughness2 = GVar2;
    return GVar3;
  }
  __assert_fail("locs.cubemap != -1 && locs.numSamples != -1 && locs.roughness2 != -1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/tg/texture_utils.cpp"
                ,0x144,"GgxFilterUnifLocs tg::getFilterCubamap_ggx_unifLocs(u32)");
}

Assistant:

GgxFilterUnifLocs getFilterCubamap_ggx_unifLocs(u32 prog)
{
    GgxFilterUnifLocs locs;
    locs.cubemap = glGetUniformLocation(prog, "u_cubemap");
    locs.numSamples = glGetUniformLocation(prog, "u_numSamples");
    locs.roughness2 = glGetUniformLocation(prog, "u_rough2");
    assert(locs.cubemap != -1 && locs.numSamples != -1 && locs.roughness2 != -1);
    return locs;
}